

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::appendTag(Builder *this,uint64_t tag)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  long lVar3;
  Exception *this_00;
  
  if (this->options->disallowTags != true) {
    if (tag < 0x100) {
      reserve(this,2);
      reserve(this,1);
      VVar2 = this->_pos;
      this->_pos = VVar2 + 1;
      this->_start[VVar2] = 0xee;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      VVar2 = this->_pos;
      this->_pos = VVar2 + 1;
      this->_start[VVar2] = (uint8_t)tag;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
    }
    else {
      reserve(this,9);
      reserve(this,1);
      VVar2 = this->_pos;
      this->_pos = VVar2 + 1;
      this->_start[VVar2] = 0xef;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      lVar3 = 8;
      do {
        VVar2 = this->_pos;
        this->_pos = VVar2 + 1;
        this->_start[VVar2] = (uint8_t)tag;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        tag = tag >> 8;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,BuilderTagsDisallowed);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Builder::appendTag(uint64_t tag) {
  if (options->disallowTags) {
    // Tagged values explicitly disallowed
    throw Exception(Exception::BuilderTagsDisallowed);
  }
  if (tag <= 255) {
    reserve(1 + 1);
    appendByte(0xee);
    appendLengthUnchecked<1>(tag);
  } else {
    reserve(1 + 8);
    appendByte(0xef);
    appendLengthUnchecked<8>(tag);
  }
}